

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_get_byseq(fdb_kvs_handle *handle,fdb_doc *doc)

{
  atomic<unsigned_long> *paVar1;
  filemgr *file;
  docio_handle *handle_00;
  size_t sVar2;
  btreeblk_handle *handle_01;
  void *__dest;
  fdb_status fVar3;
  hbtrie_result hVar4;
  btree_result bVar5;
  int64_t iVar6;
  size_t __n;
  undefined1 *puVar7;
  ulong uVar8;
  fdb_txn *txn;
  bool bVar9;
  undefined1 auStack_a8 [8];
  _fdb_key_cmp_info cmp_info;
  ulong local_80;
  fdb_seqnum_t _seqnum;
  undefined8 uStack_70;
  timestamp_t local_68;
  void *local_60;
  anon_union_8_2_18a01fae_for_docio_object_3 aStack_58;
  void *local_50;
  void *pvStack_48;
  ulong local_40;
  uint64_t offset;
  
  puVar7 = auStack_a8;
  _seqnum = 0;
  uStack_70 = 0;
  local_68 = 0;
  local_60 = (void *)0x0;
  aStack_58.seqnum = 0;
  local_50 = (void *)0x0;
  pvStack_48 = (void *)0x0;
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (doc == (fdb_doc *)0x0) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if (doc->seqnum == 0xffffffffffffffff) {
    return FDB_RESULT_INVALID_ARGS;
  }
  if ((handle->config).seqtree_opt == '\x01') {
    LOCK();
    bVar9 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
    if (bVar9) {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
    }
    UNLOCK();
    if (!bVar9) {
      return FDB_RESULT_HANDLE_BUSY;
    }
    if (handle->shandle == (snap_handle *)0x0) {
      fdb_check_file_reopen(handle,(file_status_t *)0x0);
      txn = handle->fhandle->root->txn;
      if (txn == (fdb_txn *)0x0) {
        txn = &handle->file->global_txn;
      }
    }
    else {
      txn = handle->shandle->snap_txn;
    }
    cmp_info.kvs_config.custom_cmp = (fdb_custom_cmp_variable)(handle->kvs_config).custom_cmp_param;
    auStack_a8[0] = (handle->kvs_config).create_if_missing;
    auStack_a8._1_7_ = *(undefined7 *)&(handle->kvs_config).field_0x1;
    cmp_info.kvs_config._0_8_ = (handle->kvs_config).custom_cmp;
    cmp_info.kvs_config.custom_cmp_param = handle->kvs;
    file = handle->file;
    handle_00 = handle->dhandle;
    sVar2 = doc->keylen;
    doc->keylen = 0;
    fVar3 = FDB_RESULT_KEY_NOT_FOUND;
    if ((handle->config).do_not_search_wal == false) {
      if ((kvs_info *)cmp_info.kvs_config.custom_cmp_param == (kvs_info *)0x0) {
        fVar3 = wal_find(txn,file,(_fdb_key_cmp_info *)auStack_a8,handle->shandle,doc,&local_40);
      }
      else {
        fVar3 = wal_find_kv_id(txn,file,((kvs_info *)cmp_info.kvs_config.custom_cmp_param)->id,
                               (_fdb_key_cmp_info *)auStack_a8,handle->shandle,doc,&local_40);
      }
    }
    doc->keylen = sVar2;
    if (handle->shandle == (snap_handle *)0x0) {
      fdb_sync_db_header(handle);
    }
    LOCK();
    paVar1 = &handle->op_stats->num_gets;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      _fdb_sync_dirty_root(handle);
      uVar8 = doc->seqnum;
      local_80 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                 (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                 (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                 uVar8 << 0x38;
      if (handle->kvs == (kvs_info *)0x0) {
        bVar5 = btree_find((handle->field_6).seqtree,&local_80,&local_40);
        bVar9 = bVar5 != BTREE_RESULT_FAIL;
        puVar7 = auStack_a8;
      }
      else {
        hVar4 = hbtrie_find((handle->field_6).seqtrie,&stack0xffffffffffffff48,0x10,&local_40);
        bVar9 = hVar4 == HBTRIE_RESULT_SUCCESS;
        puVar7 = &stack0xffffffffffffff48;
      }
      handle_01 = handle->bhandle;
      *(undefined8 *)(puVar7 + -8) = 0x11e7e9;
      btreeblk_end(handle_01);
      local_40 = local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
                 (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8 |
                 (local_40 & 0xff000000) << 8 | (local_40 & 0xff0000) << 0x18 |
                 (local_40 & 0xff00) << 0x28 | local_40 << 0x38;
      *(undefined8 *)(puVar7 + -8) = 0x11e7fc;
      _fdb_release_dirty_root(handle);
    }
    else {
      bVar9 = false;
    }
    if ((fVar3 == FDB_RESULT_SUCCESS && local_40 != 0xffffffffffffffff) || (bVar9)) {
      if (handle->kvs == (kvs_info *)0x0) {
        local_60 = doc->key;
        _seqnum = CONCAT62(_seqnum._2_6_,(short)doc->keylen);
        bVar9 = local_60 == (void *)0x0;
      }
      else {
        bVar9 = true;
        local_60 = (void *)0x0;
      }
      local_50 = doc->meta;
      offset._6_1_ = local_50 == (void *)0x0;
      pvStack_48 = doc->body;
      offset._7_1_ = pvStack_48 == (void *)0x0;
      if ((fVar3 != FDB_RESULT_SUCCESS) || (doc->deleted != true)) {
        *(undefined8 *)(puVar7 + -8) = 0x11e89c;
        iVar6 = docio_read_doc(handle_00,local_40,(docio_object *)&_seqnum,true);
        if (0 < iVar6) {
          if ((uStack_70 & 0x400000000) != 0) {
            LOCK();
            if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
              (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
            }
            UNLOCK();
            *(undefined8 *)(puVar7 + -8) = 0x11e93e;
            free_docio_object((docio_object *)&_seqnum,bVar9,offset._6_1_,offset._7_1_);
            return FDB_RESULT_KEY_NOT_FOUND;
          }
          doc->seqnum = (fdb_seqnum_t)aStack_58;
          if (handle->kvs == (kvs_info *)0x0) {
            doc->keylen = _seqnum & 0xffff;
            doc->key = local_60;
          }
          else {
            uVar8 = (ulong)(handle->config).chunksize;
            __n = (_seqnum & 0xffff) - uVar8;
            doc->keylen = __n;
            __dest = doc->key;
            if (__dest == (void *)0x0) {
              doc->key = local_60;
              *(undefined8 *)(puVar7 + -8) = 0x11e963;
              memmove(local_60,(void *)(uVar8 + (long)local_60),__n);
            }
            else {
              *(undefined8 *)(puVar7 + -8) = 0x11e8e0;
              memcpy(__dest,(void *)((long)local_60 + uVar8),__n);
              *(undefined8 *)(puVar7 + -8) = 0x11e8f2;
              free_docio_object((docio_object *)&_seqnum,'\x01','\0','\0');
            }
          }
          doc->metalen = _seqnum >> 0x10 & 0xffff;
          doc->bodylen = _seqnum >> 0x20;
          doc->meta = local_50;
          doc->body = pvStack_48;
          doc->deleted = (bool)(uStack_70._4_1_ >> 2 & 1);
          doc->size_ondisk =
               (ulong)(((uint)_seqnum & 0xffff) + ((uint)_seqnum >> 0x10) + (uint32_t)uStack_70) +
               0x20;
          doc->offset = local_40;
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
          return FDB_RESULT_SUCCESS;
        }
        LOCK();
        if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
          (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
        }
        UNLOCK();
        if (iVar6 != 0) {
          return (fdb_status)iVar6;
        }
        return FDB_RESULT_KEY_NOT_FOUND;
      }
    }
    LOCK();
    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    }
    UNLOCK();
    return FDB_RESULT_KEY_NOT_FOUND;
  }
  return FDB_RESULT_INVALID_CONFIG;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_byseq(fdb_kvs_handle *handle, fdb_doc *doc)
{
    uint64_t offset;
    int64_t _offset;
    struct docio_object _doc;
    struct docio_handle *dhandle;
    struct filemgr *wal_file = NULL;
    fdb_status wr;
    btree_result br = BTREE_RESULT_FAIL;
    fdb_seqnum_t _seqnum;
    fdb_txn *txn;
    struct _fdb_key_cmp_info cmp_info;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc || doc->seqnum == SEQNUM_NOT_USED) {
        return FDB_RESULT_INVALID_ARGS;
    }

    // Sequence trees are a must for byseq operations
    if (handle->config.seqtree_opt != FDB_SEQTREE_USE) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);

        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;
    wal_file = handle->file;
    dhandle = handle->dhandle;

    // prevent searching by key in WAL if 'doc' is not empty
    size_t key_len = doc->keylen;
    doc->keylen = 0;

    if (handle->config.do_not_search_wal) {
        wr = FDB_RESULT_KEY_NOT_FOUND;
    } else {
        if (handle->kvs) {
            wr = wal_find_kv_id(txn, wal_file, handle->kvs->id, &cmp_info,
                                handle->shandle, doc, &offset);
        } else {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, doc, &offset);
        }
    }

    doc->keylen = key_len;
    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    if (wr == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root(handle);

        _seqnum = _endian_encode(doc->seqnum);
        if (handle->kvs) {
            int size_id, size_seq;
            uint8_t *kv_seqnum;
            hbtrie_result hr;
            fdb_kvs_id_t _kv_id;

            _kv_id = _endian_encode(handle->kvs->id);
            size_id = sizeof(fdb_kvs_id_t);
            size_seq = sizeof(fdb_seqnum_t);
            kv_seqnum = alca(uint8_t, size_id + size_seq);
            memcpy(kv_seqnum, &_kv_id, size_id);
            memcpy(kv_seqnum + size_id, &_seqnum, size_seq);
            hr = hbtrie_find(handle->seqtrie, (void *)kv_seqnum,
                             size_id + size_seq, (void *)&offset);
            br = (hr == HBTRIE_RESULT_SUCCESS)?(BTREE_RESULT_SUCCESS):(br);
        } else {
            br = btree_find(handle->seqtree, (void *)&_seqnum, (void *)&offset);
        }
        btreeblk_end(handle->bhandle);
        offset = _endian_decode(offset);

        _fdb_release_dirty_root(handle);
    }

    if ((wr == FDB_RESULT_SUCCESS && offset != BLK_NOT_FOUND) ||
         br != BTREE_RESULT_FAIL) {
        bool alloc_key, alloc_meta, alloc_body;
        if (!handle->kvs) { // single KVS mode
            _doc.key = doc->key;
            _doc.length.keylen = doc->keylen;
            alloc_key = doc->key ? false : true;
        } else {
            _doc.key = NULL;
            alloc_key = true;
        }
        alloc_meta = doc->meta ? false : true;
        _doc.meta = doc->meta;
        alloc_body = doc->body ? false : true;
        _doc.body = doc->body;

        if (wr == FDB_RESULT_SUCCESS && doc->deleted) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        _offset = docio_read_doc(dhandle, offset, &_doc, true);
        if (_offset <= 0) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.flag & DOCIO_DELETED) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            free_docio_object(&_doc, alloc_key, alloc_meta, alloc_body);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        doc->seqnum = _doc.seqnum;
        if (handle->kvs) {
            int size_chunk = handle->config.chunksize;
            doc->keylen = _doc.length.keylen - size_chunk;
            if (doc->key) { // doc->key is given by user
                memcpy(doc->key, (uint8_t*)_doc.key + size_chunk, doc->keylen);
                free_docio_object(&_doc, 1, 0, 0);
            } else {
                doc->key = _doc.key;
                memmove(doc->key, (uint8_t*)doc->key + size_chunk, doc->keylen);
            }
        } else {
            doc->keylen = _doc.length.keylen;
            doc->key = _doc.key;
        }
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}